

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O3

int cat(int argc,char **argv)

{
  int iVar1;
  ulonglong uVar2;
  long lVar3;
  size_t sVar4;
  char buf [8192];
  undefined1 auStack_2028 [8200];
  
  uVar2 = strtoull(*argv,(char **)0x0,10);
  lVar3 = zip_fopen_index(za,uVar2,0);
  if (lVar3 == 0) {
    cat_cold_4();
  }
  else {
    do {
      sVar4 = zip_fread(lVar3,auStack_2028,0x2000);
      if ((long)sVar4 < 1) {
        if (sVar4 == 0xffffffffffffffff) {
          cat_cold_2();
          return -1;
        }
        iVar1 = zip_fclose(lVar3);
        if (iVar1 != 0) {
          cat_cold_1();
          return -1;
        }
        return 0;
      }
      sVar4 = fwrite(auStack_2028,sVar4,1,_stdout);
    } while (sVar4 == 1);
    cat_cold_3();
  }
  return -1;
}

Assistant:

static int
cat(int argc, char *argv[]) {
    /* output file contents to stdout */
    zip_uint64_t idx;
    zip_int64_t n;
    zip_file_t *zf;
    char buf[8192];
    int err;
    idx = strtoull(argv[0], NULL, 10);

#ifdef _WIN32
    /* Need to set stdout to binary mode for Windows */
    setmode(fileno(stdout), _O_BINARY);
#endif
    if ((zf = zip_fopen_index(za, idx, 0)) == NULL) {
	fprintf(stderr, "can't open file at index '%" PRIu64 "': %s\n", idx, zip_strerror(za));
	return -1;
    }
    while ((n = zip_fread(zf, buf, sizeof(buf))) > 0) {
	if (fwrite(buf, (size_t)n, 1, stdout) != 1) {
	    zip_fclose(zf);
	    fprintf(stderr, "can't write file contents to stdout: %s\n", strerror(errno));
	    return -1;
	}
    }
    if (n == -1) {
	fprintf(stderr, "can't read file at index '%" PRIu64 "': %s\n", idx, zip_file_strerror(zf));
	zip_fclose(zf);
	return -1;
    }
    if ((err = zip_fclose(zf)) != 0) {
	zip_error_t error;

	zip_error_init_with_code(&error, err);
	fprintf(stderr, "can't close file at index '%" PRIu64 "': %s\n", idx, zip_error_strerror(&error));
	return -1;
    }

    return 0;
}